

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

dec_proc2_output __thiscall
sophia_interface::dec_proc2(sophia_interface *this,double x,int IRES,int L0)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  dec_proc2_output extraout_RAX;
  runtime_error *prVar6;
  int in_ECX;
  int *piVar7;
  int iVar8;
  int extraout_EDX;
  ulong uVar9;
  char *pcVar10;
  sophia_interface *this_00;
  int in_R8D;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  double __x;
  double dVar15;
  runtime_error local_178 [16];
  runtime_error local_168 [16];
  runtime_error local_158 [16];
  runtime_error local_148 [16];
  runtime_error local_138 [16];
  runtime_error local_128 [16];
  runtime_error local_118 [16];
  runtime_error local_108 [16];
  runtime_error local_f8 [16];
  runtime_error local_e8 [16];
  runtime_error local_d8 [16];
  runtime_error local_c8 [16];
  runtime_error local_b8 [16];
  runtime_error local_a8 [16];
  undefined1 local_98 [24];
  double prob_sum [10];
  
  prob_sum[7] = 0.0;
  prob_sum[8] = 0.0;
  prob_sum[5] = 0.0;
  prob_sum[6] = 0.0;
  prob_sum[3] = 0.0;
  prob_sum[4] = 0.0;
  prob_sum[1] = 0.0;
  prob_sum[2] = 0.0;
  local_98._16_4_ = 0;
  local_98._20_4_ = 0;
  prob_sum[0] = 0.0;
  if (L0 == 0xe) {
    uVar12 = 0;
    dVar14 = RLU(this,false);
    iVar11 = *(int *)(&DAT_00133afc + (long)IRES * 4);
    if (iVar11 < 1) {
      uVar12 = 1;
    }
    else {
      iVar8 = IRES * 4 + -4;
      if (iVar8 < iVar8 + iVar11 + -1) {
        uVar12 = 0;
        uVar9 = 1;
        do {
          if ((x <= RESLIMn[(long)iVar8 + uVar9]) &&
             (pdVar1 = (double *)((long)iVar8 * 8 + 0x1339a8 + uVar9 * 8),
             *pdVar1 <= x && x != *pdVar1)) {
            uVar12 = uVar9 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
        } while (iVar11 != (int)uVar9);
      }
    }
    lVar5 = (long)IRES + -1;
    local_98._16_4_ = 0;
    local_98._20_4_ = 0;
    iVar11 = (int)uVar12;
    if (iVar11 == 3) {
      uVar2 = IDBRES3n[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_c8,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_c8);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES3n + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_b8;
    }
    else if (iVar11 == 2) {
      uVar2 = IDBRES2n[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_e8,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_e8);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES2n + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_d8;
    }
    else if (iVar11 == 1) {
      uVar2 = IDBRES1n[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_108,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_108);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES1n + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_f8;
    }
    else {
      pcVar10 = "invalid IRANGE in DEC_PROC2";
      prVar6 = local_a8;
    }
  }
  else {
    if (L0 != 0xd) {
      this_00 = (sophia_interface *)local_98;
      dec_proc2(this_00);
      this_00->np = 2;
      if (in_R8D == 0xe) {
        if (in_ECX == 3) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES3n;
        }
        else if (in_ECX == 2) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES2n;
        }
        else {
          if (in_ECX != 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"error in RES_DECAY3");
            goto LAB_00108b14;
          }
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES1n;
        }
      }
      else {
        if (in_R8D != 0xd) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"no valid L0 in RES_DECAY3");
LAB_00108b14:
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (in_ECX == 3) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES3p;
        }
        else if (in_ECX == 2) {
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES2p;
        }
        else {
          if (in_ECX != 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"error in RES_DECAY3");
            goto LAB_00108b14;
          }
          lVar5 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES1p;
        }
      }
      iVar11 = piVar7[lVar5];
      iVar8 = piVar7[extraout_EDX * 5 + -2];
      this_00->LLIST[0] = iVar11;
      this_00->LLIST[1] = iVar8;
      dVar14 = scatterangle(this_00,IRES,in_R8D);
      if (__x < 0.0) {
        dVar15 = sqrt(__x);
      }
      else {
        dVar15 = SQRT(__x);
      }
      PROC_TWOPART(this_00,iVar11,iVar8,dVar15,dVar14);
      return extraout_RAX;
    }
    uVar12 = 0;
    dVar14 = RLU(this,false);
    iVar11 = *(int *)((long)RESLIMn + (long)IRES * 4 + 0x11c);
    if (iVar11 < 1) {
      uVar12 = 1;
    }
    else {
      iVar8 = IRES * 4 + -4;
      if (iVar8 < iVar8 + iVar11 + -1) {
        uVar12 = 0;
        uVar9 = 1;
        do {
          if ((x <= RESLIMp[(long)iVar8 + uVar9]) &&
             (pdVar1 = (double *)((long)iVar8 * 8 + 0x133888 + uVar9 * 8),
             *pdVar1 <= x && x != *pdVar1)) {
            uVar12 = uVar9 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
        } while (iVar11 != (int)uVar9);
      }
    }
    lVar5 = (long)IRES + -1;
    local_98._16_4_ = 0;
    local_98._20_4_ = 0;
    iVar11 = (int)uVar12;
    if (iVar11 == 3) {
      uVar2 = IDBRES3p[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_138,"invalid resonance in energy range 3");
        std::runtime_error::~runtime_error(local_138);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES3p + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_128;
    }
    else if (iVar11 == 2) {
      uVar2 = IDBRES2p[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_158,"invalid resonance in energy range 2");
        std::runtime_error::~runtime_error(local_158);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES2p + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_148;
    }
    else if (iVar11 == 1) {
      uVar2 = IDBRES1p[lVar5];
      if (uVar2 == 0) {
        std::runtime_error::runtime_error(local_178,"invalid resonance in energy range 1");
        std::runtime_error::~runtime_error(local_178);
      }
      uVar4 = 0xffffffff;
      lVar5 = 0;
      uVar3 = uVar2;
      do {
        uVar13 = uVar3;
        dVar15 = *(double *)((long)CBRRES1p + lVar5 + (long)(int)(uVar2 - 1) * 8);
        *(double *)((long)prob_sum + lVar5) = dVar15;
        uVar3 = uVar4;
        if (*(double *)((long)prob_sum + lVar5 + -8) <= dVar14) {
          uVar3 = uVar13;
        }
        if (dVar15 <= dVar14) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        lVar5 = lVar5 + 8;
        uVar3 = uVar13 + 1;
      } while (dVar15 < 1.0);
      if (dVar14 != 1.0) {
        uVar13 = uVar4;
      }
      if (NAN(dVar14)) {
        uVar13 = uVar4;
      }
      uVar9 = (ulong)uVar13;
      if (uVar13 != 0xffffffff) goto LAB_00108968;
      pcVar10 = "no resonance decay possible !";
      prVar6 = local_168;
    }
    else {
      pcVar10 = "invalid IRANGE in DEC_PROC2";
      prVar6 = local_118;
    }
  }
  std::runtime_error::runtime_error(prVar6,pcVar10);
  std::runtime_error::~runtime_error(prVar6);
  uVar9 = 0xffffffff;
LAB_00108968:
  return (dec_proc2_output)(uVar9 | uVar12 << 0x20);
}

Assistant:

dec_proc2_output sophia_interface::dec_proc2(double x, int IRES, int L0) {
// decide which decay with ID=IPROC of resonance IRES takes place ***
// Date: 20/01/98   **
// correct.: 27/04/98*
// author: A.Muecke **
    int IPROC = 0;
    int IRANGE = 0;
    double prob_sum[10] = {0.};

    // choose arrays /S_RESp/ for charged resonances,
    //        arrays /S_RESn/ for neutral resonances
    if (L0 == 13) {
        // charged resonances:
        double r = RNDM();
        // determine the energy range of the resonance:
        int nlim = ELIMITSp[IRES - 1];
        int istart = (IRES - 1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                double reslimp1 = RESLIMp[ie - 1];
                double reslimp2 = RESLIMp[ie];
                if (x <= reslimp2 && x > reslimp1) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }

        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 1");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 2) {
            j = IDBRES2p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 2");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 3");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES3p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else if (L0 == 14) {
        // neutral resonances:
        double r = RNDM();
        //determine the energy range of the resonance:
        int nlim = ELIMITSn[IRES - 1];
        int istart = (IRES-1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                if (x <= RESLIMn[ie] && x > RESLIMn[ie - 1]) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }
        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
                if (r == 1.) IPROC = j;
                if (IPROC == -1) {
                    std::runtime_error("no resonance decay possible !");
                }
        } else if (IRANGE == 2) {
            j = IDBRES2n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                    prob_sum[i] = CBRRES3n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else {
        std::runtime_error("no valid L0 in DEC_PROC !");
    }    
}